

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpCodeUtil.cpp
# Opt level: O1

OpCode Js::OpCodeUtil::ConvertProfiledReturnTypeCallOpToNonProfiled(OpCode op)

{
  code *pcVar1;
  bool bVar2;
  OpCode OVar3;
  undefined4 *puVar4;
  undefined6 in_register_0000003a;
  OpCode OVar5;
  
  if (((uint)CONCAT62(in_register_0000003a,op) & 0xfffffffc) == 0xf8) {
    OVar5 = op - NewScFuncHomeObj;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/OpCodeUtil.cpp"
                                ,0x9e,"(false)","false");
    if (!bVar2) goto LAB_008b09e0;
    *puVar4 = 0;
    OVar5 = InvalidOpCode;
  }
  OVar3 = DebugConvertProfiledReturnTypeCallToNonProfiled(op);
  if (OVar3 != OVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/OpCodeUtil.cpp"
                                ,0xa2,
                                "(DebugConvertProfiledReturnTypeCallToNonProfiled(op) == newOpcode)"
                                ,"DebugConvertProfiledReturnTypeCallToNonProfiled(op) == newOpcode")
    ;
    if (!bVar2) {
LAB_008b09e0:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return OVar5;
}

Assistant:

OpCode OpCodeUtil::ConvertProfiledReturnTypeCallOpToNonProfiled(OpCode op)
    {
        OpCode newOpcode = Js::OpCode::InvalidOpCode;
        if (IsProfiledReturnTypeCallOp(op))
        {
            newOpcode = (OpCode)(op - Js::OpCode::ProfiledReturnTypeCallI + Js::OpCode::CallI);
        }
        else
        {
            Assert(false);
            __assume(false);
        }

        Assert(DebugConvertProfiledReturnTypeCallToNonProfiled(op) == newOpcode);
        return newOpcode;
    }